

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)

{
  UInt32 UVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  
  p->Low = 0;
  p->Bottom = 0;
  p->Range = 0xffffffff;
  iVar3 = 4;
  while( true ) {
    UVar1 = p->Code;
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) break;
    bVar2 = (*p->Stream->Read)(p->Stream);
    p->Code = (uint)bVar2 | UVar1 << 8;
  }
  return (uint)(UVar1 != 0xffffffff);
}

Assistant:

static Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)
{
  unsigned i;
  p->Low = p->Bottom = 0;
  p->Range = 0xFFFFFFFF;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
  return (p->Code < 0xFFFFFFFF);
}